

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int UnixVfs_link(char *zSrc,char *zTarget,int is_sym)

{
  int iVar1;
  
  if (is_sym == 0) {
    iVar1 = link(zSrc,zTarget);
  }
  else {
    iVar1 = symlink(zSrc,zTarget);
  }
  return -(uint)(iVar1 != 0);
}

Assistant:

static int UnixVfs_link(const char *zSrc, const char *zTarget, int is_sym)
{
	int rc;
	if( is_sym ){
		/* Symbolic link */
		rc = symlink(zSrc, zTarget);
	}else{
		/* Hard link */
		rc = link(zSrc, zTarget);
	}
	return rc == 0 ? JX9_OK : -1;
}